

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::fastAccessDx
                    (in_RDI,in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          ::val((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                 *)0x1863357);
  vVar3 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          ::fastAccessDx((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                          *)in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x1863382);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}